

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O3

void __thiscall
Js::DictionaryPropertyDescriptor<unsigned_short>::AddShadowedData
          (DictionaryPropertyDescriptor<unsigned_short> *this,unsigned_short *nextPropertyIndex,
          bool addingLetConstGlobal)

{
  code *pcVar1;
  bool bVar2;
  Flags FVar3;
  unsigned_short uVar4;
  undefined4 *puVar5;
  
  FVar3 = this->flags;
  if ((FVar3 & IsShadowed) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0xef,"(!GetIsShadowed())","!GetIsShadowed()");
    if (!bVar2) goto LAB_00da0f9b;
    *puVar5 = 0;
    FVar3 = this->flags;
  }
  this->flags = FVar3 | IsShadowed;
  if ((FVar3 & IsAccessor) == None) {
    if (addingLetConstGlobal) {
      this->Getter = this->Data;
      goto LAB_00da0ef4;
    }
    uVar4 = *nextPropertyIndex;
    if (uVar4 == 0xffff) goto LAB_00da0f9d;
    *nextPropertyIndex = uVar4 + 1;
    this->Getter = uVar4;
LAB_00da0f30:
    this->Attributes = this->Attributes | 0x10;
    uVar4 = GetDataPropertyIndex<false>(this);
  }
  else {
    if (this->Data != 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xf3,"(this->Data == NoSlots)","this->Data == NoSlots");
      if (!bVar2) goto LAB_00da0f9b;
      *puVar5 = 0;
    }
    if (!addingLetConstGlobal) goto LAB_00da0f30;
LAB_00da0ef4:
    uVar4 = *nextPropertyIndex;
    if (uVar4 == 0xffff) {
LAB_00da0f9d:
      ::Math::DefaultOverflowPolicy();
    }
    *nextPropertyIndex = uVar4 + 1;
    this->Data = uVar4;
    this->Attributes = this->Attributes | 0x10;
    uVar4 = GetDataPropertyIndex<true>(this);
  }
  if (uVar4 == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0x103,
                                "((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots)"
                                ,
                                "(addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots"
                               );
    if (!bVar2) {
LAB_00da0f9b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DictionaryPropertyDescriptor<TPropertyIndex>::AddShadowedData(TPropertyIndex& nextPropertyIndex, bool addingLetConstGlobal)
    {
        Assert(!GetIsShadowed());
        SetIsShadowed(true);
        if (GetIsAccessor())
        {
            Assert(this->Data == NoSlots);
            if (addingLetConstGlobal)
            {
                this->Data = ::Math::PostInc(nextPropertyIndex);
            }
        }
        else if (addingLetConstGlobal)
        {
            this->Getter = this->Data;
            this->Data = ::Math::PostInc(nextPropertyIndex);
        }
        else
        {
            this->Getter = ::Math::PostInc(nextPropertyIndex);
        }
        this->Attributes |= PropertyLetConstGlobal;
        Assert((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots);
    }